

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_ULong FT_Stream_GetULong(FT_Stream stream)

{
  byte *pbVar1;
  ulong local_20;
  FT_ULong result;
  FT_Byte *p;
  FT_Stream stream_local;
  
  local_20 = 0;
  pbVar1 = stream->cursor;
  result = (FT_ULong)pbVar1;
  if (pbVar1 + 3 < stream->limit) {
    result = (FT_ULong)(pbVar1 + 4);
    local_20 = (ulong)((uint)*pbVar1 << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 |
                      (uint)pbVar1[3]);
  }
  stream->cursor = (uchar *)result;
  return local_20;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_GetULong( FT_Stream  stream )
  {
    FT_Byte*  p;
    FT_ULong  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 3 < stream->limit )
      result       = FT_NEXT_ULONG( p );
    stream->cursor = p;
    return result;
  }